

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u32.c
# Opt level: O3

void u32To(void *dest,size_t count,u32 *src)

{
  memMove(dest,src,count);
  return;
}

Assistant:

void u32To(void* dest, size_t count, const u32 src[])
{
	ASSERT(memIsValid(src, (count + 3) / 4 * 4));
	ASSERT(memIsValid(dest, count));
	memMove(dest, src, count);
#if (OCTET_ORDER == BIG_ENDIAN)
	if (count % 4)
	{
		size_t t = count / 4;
		register u32 u = src[t];
		for (t *= 4; t < count; ++t, u >>= 8)
			((octet*)dest)[t] = (octet)u;
	}
	for (count /= 4; count--;)
		((u32*)dest)[count] = u32Rev(((u32*)dest)[count]);
#endif // OCTET_ORDER
}